

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

AActor * RoughBlockCheck(AActor *mo,int index,void *param)

{
  FBlockNode *pFVar1;
  bool bVar2;
  AActor *target;
  
  pFVar1 = blocklinks[index];
  do {
    if (pFVar1 == (FBlockNode *)0x0) {
      return (AActor *)0x0;
    }
    target = pFVar1->Me;
    if (target != mo) {
      if (*param == '\x01') {
        bVar2 = AActor::CanSeek(mo,target);
        if (!bVar2) goto LAB_0041c9ea;
        target = pFVar1->Me;
      }
      if (((*(char *)((long)param + 1) != '\x01') ||
          (*(double *)((long)param + 0x20) * (*(double *)((long)param + 8) - (target->__Pos).X) +
           *(double *)((long)param + 0x18) * ((target->__Pos).Y - *(double *)((long)param + 0x10))
           <= 1.52587890625e-05)) && (bVar2 = AActor::IsOkayToAttack(mo,target), bVar2)) {
        return pFVar1->Me;
      }
    }
LAB_0041c9ea:
    pFVar1 = pFVar1->NextActor;
  } while( true );
}

Assistant:

static AActor *RoughBlockCheck (AActor *mo, int index, void *param)
{
	BlockCheckInfo *info = (BlockCheckInfo *)param;

	FBlockNode *link;

	for (link = blocklinks[index]; link != NULL; link = link->NextActor)
	{
		if (link->Me != mo)
		{
			if (info->onlyseekable && !mo->CanSeek(link->Me))
			{
				continue;
			}
			if (info->frontonly && P_PointOnDivlineSide(link->Me->X(), link->Me->Y(), &info->frontline) != 0)
			{
				continue;
			}
			if (mo->IsOkayToAttack (link->Me))
			{
				return link->Me;
			}
		}
	}
	return NULL;
}